

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::HasItemQuery(CustomExternalWrapperObject *this,uint32 index)

{
  anon_class_16_2_f7f469bf fn_00;
  BOOL val;
  PropertyQueryFlags PVar1;
  anon_class_8_1_a81517f2 getPropertyName;
  anon_class_16_2_f7f469bf fn;
  uint32 index_local;
  CustomExternalWrapperObject *this_local;
  
  fn.this = (CustomExternalWrapperObject *)((long)&fn.index + 4);
  fn_00.index = (uint32 *)fn.this;
  fn_00.this = this;
  fn.index._4_4_ = index;
  val = HasPropertyTrap<Js::CustomExternalWrapperObject::HasItemQuery(unsigned_int)::__0,Js::CustomExternalWrapperObject::HasItemQuery(unsigned_int)::__1>
                  (this,fn_00,(uint32 *)((long)&fn.index + 4),(PropertyValueInfo *)0x0);
  PVar1 = JavascriptConversion::BooleanToPropertyQueryFlags(val);
  return PVar1;
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::HasItemQuery(uint32 index)
{
    auto fn = [&](Js::RecyclableObject* object)-> BOOL {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasItemQuery(index));
    };

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        *isPropertyNameNumeric = requestContext->GetLibrary()->GetTrue();
        *propertyNameNumericValue = JavascriptNumber::ToVar(index, requestContext);
        return nullptr;
    };

    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyName, nullptr));
}